

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

string * __thiscall pbrt::syntactic::SurfaceIntegrator::toString_abi_cxx11_(SurfaceIntegrator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __lhs = &local_30;
  __rhs = in_RDI;
  std::operator+((char *)in_RDI,in_RSI);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

virtual std::string toString() const override { return "SurfaceIntegrator<"+type+">"; }